

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleScriptMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  long lVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  pointer pbVar10;
  char *__s;
  cmInstallScriptGenerator *pcVar11;
  cmGlobalGenerator *this_00;
  ulong uVar12;
  long lVar13;
  undefined4 uVar14;
  pointer pbVar15;
  bool bVar16;
  string script;
  string component;
  string local_a0;
  cmInstallCommand *local_80;
  undefined4 local_74;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_70[0] = local_60;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_80 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 == pbVar15) {
    uVar14 = 0;
LAB_002c4671:
    if (pbVar10 == pbVar15) {
LAB_002c4946:
      this_00 = cmMakefile::GetGlobalGenerator((local_80->super_cmCommand).Makefile);
      bVar16 = true;
      cmGlobalGenerator::AddInstallComponent(this_00,(char *)local_70[0]);
      goto LAB_002c4964;
    }
    lVar13 = 0;
    uVar12 = 0;
    bVar4 = false;
    bVar6 = false;
    local_74 = uVar14;
    do {
      iVar9 = std::__cxx11::string::compare((char *)((long)&(pbVar15->_M_dataplus)._M_p + lVar13));
      if (iVar9 == 0) {
        bVar6 = true;
LAB_002c4838:
        bVar4 = false;
      }
      else {
        iVar9 = std::__cxx11::string::compare
                          ((char *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar13));
        if (iVar9 == 0) {
          bVar4 = true;
          bVar6 = false;
        }
        else {
          iVar9 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar13));
          if (iVar9 == 0) {
            bVar6 = false;
            goto LAB_002c4838;
          }
          if (bVar6) {
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            lVar2 = *(long *)((long)&(pbVar10->_M_dataplus)._M_p + lVar13);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,lVar2,
                       *(long *)((long)&pbVar10->_M_string_length + lVar13) + lVar2);
            bVar6 = cmsys::SystemTools::FileIsFullPath(local_a0._M_dataplus._M_p);
            if (!bVar6) {
              __s = cmMakefile::GetCurrentSourceDirectory((local_80->super_cmCommand).Makefile);
              sVar5 = local_a0._M_string_length;
              strlen(__s);
              std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)sVar5,(ulong)__s);
              std::__cxx11::string::append((char *)&local_a0);
              std::__cxx11::string::_M_append
                        ((char *)&local_a0,
                         *(ulong *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar13));
            }
            bVar7 = cmsys::SystemTools::FileIsDirectory(&local_a0);
            if (bVar7) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"given a directory as value of SCRIPT argument.","");
              cmCommand::SetError(&local_80->super_cmCommand,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              pcVar3 = (local_80->super_cmCommand).Makefile;
              pcVar11 = (cmInstallScriptGenerator *)operator_new(0xe0);
              cmInstallScriptGenerator::cmInstallScriptGenerator
                        (pcVar11,local_a0._M_dataplus._M_p,false,(char *)local_70[0],
                         SUB41(local_74,0));
              cmMakefile::AddInstallGenerator(pcVar3,(cmInstallGenerator *)pcVar11);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            bVar6 = false;
            bVar16 = false;
            if (bVar7) goto LAB_002c4964;
          }
          else if (bVar4) {
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pcVar3 = (local_80->super_cmCommand).Makefile;
            pcVar11 = (cmInstallScriptGenerator *)operator_new(0xe0);
            cmInstallScriptGenerator::cmInstallScriptGenerator
                      (pcVar11,*(char **)((long)&(pbVar10->_M_dataplus)._M_p + lVar13),true,
                       (char *)local_70[0],SUB41(local_74,0));
            cmMakefile::AddInstallGenerator(pcVar3,(cmInstallGenerator *)pcVar11);
            goto LAB_002c4838;
          }
        }
      }
      uVar12 = uVar12 + 1;
      pbVar15 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x20;
    } while (uVar12 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5
                             ));
    if (bVar6) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"given no value for SCRIPT argument.","");
      cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
    }
    else {
      if (!bVar4) goto LAB_002c4946;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"given no value for CODE argument.","");
      cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_002c465a;
  }
  else {
    iVar9 = 0;
    uVar12 = 0;
    uVar14 = 0;
    do {
      iVar8 = std::__cxx11::string::compare((char *)(pbVar15 + uVar12));
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((iVar8 == 0) &&
         (uVar12 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5))) {
        std::__cxx11::string::_M_assign((string *)local_70);
        iVar9 = iVar9 + 1;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = uVar12 + 1;
      }
      iVar8 = std::__cxx11::string::compare((char *)(pbVar10 + uVar12));
      if (iVar8 == 0) {
        uVar14 = 1;
      }
      uVar12 = uVar12 + 1;
      pbVar15 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar12 < (ulong)((long)pbVar10 - (long)pbVar15 >> 5));
    if (iVar9 < 2) goto LAB_002c4671;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    cmCommand::SetError(&local_80->super_cmCommand,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_002c465a:
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar16 = false;
LAB_002c4964:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return bVar16;
}

Assistant:

bool cmInstallCommand::HandleScriptMode(std::vector<std::string> const& args)
{
  std::string component = this->DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    }
  }

  if (componentCount > 1) {
    this->SetError("given more than one COMPONENT for the SCRIPT or CODE "
                   "signature of the INSTALL command. "
                   "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (args[i] == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (args[i] == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = args[i];
      if (!cmSystemTools::FileIsFullPath(script.c_str())) {
        script = this->Makefile->GetCurrentSourceDirectory();
        script += "/";
        script += args[i];
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        this->SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        script.c_str(), false, component.c_str(), exclude_from_all));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = args[i];
      this->Makefile->AddInstallGenerator(new cmInstallScriptGenerator(
        code.c_str(), true, component.c_str(), exclude_from_all));
    }
  }

  if (doing_script) {
    this->SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    this->SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component.c_str());

  return true;
}